

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O2

int __thiscall sf::priv::JoystickImpl::open(JoystickImpl *this,char *__file,int __oflag,...)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int __fd;
  int __fd_00;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  int *piVar7;
  udev_device *puVar8;
  ostream *poVar9;
  undefined8 extraout_RAX;
  JoystickState *pJVar10;
  long lVar11;
  byte bVar12;
  allocator<char> local_139;
  string devnode_1;
  char name [128];
  string local_90;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_70
  ;
  string devnode;
  
  bVar12 = 0;
  if ((ulong)((DAT_0021a8b0 - (anonymous_namespace)::joystickList) / 0x48) <=
      ((ulong)__file & 0xffffffff)) {
    return 0;
  }
  lVar11 = ((ulong)__file & 0xffffffff) * 0x48;
  if (*(char *)((anonymous_namespace)::joystickList + 0x40 + lVar11) != '\x01') {
    return 0;
  }
  std::__cxx11::string::string
            ((string *)&devnode,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((anonymous_namespace)::joystickList + lVar11));
  __fd = ::open(devnode._M_dataplus._M_p,0x800);
  this->m_file = __fd;
  if (__fd < 0) {
    poVar9 = err();
    poVar9 = std::operator<<(poVar9,"Failed to open joystick ");
    poVar9 = std::operator<<(poVar9,(string *)&devnode);
    poVar9 = std::operator<<(poVar9,": ");
    piVar7 = __errno_location();
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar7);
    std::endl<char,std::char_traits<char>>(poVar9);
    goto LAB_0011fb17;
  }
  ioctl(__fd,0x80406a32,this->m_mapping);
  std::__cxx11::string::string
            ((string *)&devnode_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((anonymous_namespace)::joystickList + lVar11));
  __fd_00 = ::open(devnode_1._M_dataplus._M_p,0x800);
  if (__fd_00 < 0) {
LAB_0011f7cd:
    if (((anonymous_namespace)::udevContext != 0) &&
       (puVar8 = (udev_device *)
                 udev_device_new_from_syspath
                           ((anonymous_namespace)::udevContext,
                            *(undefined8 *)((anonymous_namespace)::joystickList + 0x20 + lVar11)),
       puVar8 != (udev_device *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)name,"product",&local_139);
      pcVar6 = anon_unknown.dwarf_9f7fb::getUsbAttribute(puVar8,(string *)name);
      std::__cxx11::string::~string((string *)name);
      udev_device_unref(puVar8);
      if (pcVar6 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,pcVar6,(allocator<char> *)name);
        goto LAB_0011f8e5;
      }
    }
    poVar9 = err();
    poVar9 = std::operator<<(poVar9,"Unable to get name for joystick ");
    poVar9 = std::operator<<(poVar9,(string *)&devnode_1);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Unknown Joystick",(allocator<char> *)name);
  }
  else {
    name[0x70] = '\0';
    name[0x71] = '\0';
    name[0x72] = '\0';
    name[0x73] = '\0';
    name[0x74] = '\0';
    name[0x75] = '\0';
    name[0x76] = '\0';
    name[0x77] = '\0';
    name[0x78] = '\0';
    name[0x79] = '\0';
    name[0x7a] = '\0';
    name[0x7b] = '\0';
    name[0x7c] = '\0';
    name[0x7d] = '\0';
    name[0x7e] = '\0';
    name[0x7f] = '\0';
    name[0x60] = '\0';
    name[0x61] = '\0';
    name[0x62] = '\0';
    name[99] = '\0';
    name[100] = '\0';
    name[0x65] = '\0';
    name[0x66] = '\0';
    name[0x67] = '\0';
    name[0x68] = '\0';
    name[0x69] = '\0';
    name[0x6a] = '\0';
    name[0x6b] = '\0';
    name[0x6c] = '\0';
    name[0x6d] = '\0';
    name[0x6e] = '\0';
    name[0x6f] = '\0';
    name[0x50] = '\0';
    name[0x51] = '\0';
    name[0x52] = '\0';
    name[0x53] = '\0';
    name[0x54] = '\0';
    name[0x55] = '\0';
    name[0x56] = '\0';
    name[0x57] = '\0';
    name[0x58] = '\0';
    name[0x59] = '\0';
    name[0x5a] = '\0';
    name[0x5b] = '\0';
    name[0x5c] = '\0';
    name[0x5d] = '\0';
    name[0x5e] = '\0';
    name[0x5f] = '\0';
    name[0x40] = '\0';
    name[0x41] = '\0';
    name[0x42] = '\0';
    name[0x43] = '\0';
    name[0x44] = '\0';
    name[0x45] = '\0';
    name[0x46] = '\0';
    name[0x47] = '\0';
    name[0x48] = '\0';
    name[0x49] = '\0';
    name[0x4a] = '\0';
    name[0x4b] = '\0';
    name[0x4c] = '\0';
    name[0x4d] = '\0';
    name[0x4e] = '\0';
    name[0x4f] = '\0';
    name[0x30] = '\0';
    name[0x31] = '\0';
    name[0x32] = '\0';
    name[0x33] = '\0';
    name[0x34] = '\0';
    name[0x35] = '\0';
    name[0x36] = '\0';
    name[0x37] = '\0';
    name[0x38] = '\0';
    name[0x39] = '\0';
    name[0x3a] = '\0';
    name[0x3b] = '\0';
    name[0x3c] = '\0';
    name[0x3d] = '\0';
    name[0x3e] = '\0';
    name[0x3f] = '\0';
    name[0x20] = '\0';
    name[0x21] = '\0';
    name[0x22] = '\0';
    name[0x23] = '\0';
    name[0x24] = '\0';
    name[0x25] = '\0';
    name[0x26] = '\0';
    name[0x27] = '\0';
    name[0x28] = '\0';
    name[0x29] = '\0';
    name[0x2a] = '\0';
    name[0x2b] = '\0';
    name[0x2c] = '\0';
    name[0x2d] = '\0';
    name[0x2e] = '\0';
    name[0x2f] = '\0';
    name[0x10] = '\0';
    name[0x11] = '\0';
    name[0x12] = '\0';
    name[0x13] = '\0';
    name[0x14] = '\0';
    name[0x15] = '\0';
    name[0x16] = '\0';
    name[0x17] = '\0';
    name[0x18] = '\0';
    name[0x19] = '\0';
    name[0x1a] = '\0';
    name[0x1b] = '\0';
    name[0x1c] = '\0';
    name[0x1d] = '\0';
    name[0x1e] = '\0';
    name[0x1f] = '\0';
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    name[8] = '\0';
    name[9] = '\0';
    name[10] = '\0';
    name[0xb] = '\0';
    name[0xc] = '\0';
    name[0xd] = '\0';
    name[0xe] = '\0';
    name[0xf] = '\0';
    iVar4 = ioctl(__fd_00,0x80806a13);
    ::close(__fd_00);
    if (iVar4 < 0) goto LAB_0011f7cd;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,name,&local_139);
  }
LAB_0011f8e5:
  std::__cxx11::string::~string((string *)&devnode_1);
  std::locale::locale((locale *)name);
  String::String((String *)&local_70,&local_90,(locale *)name);
  String::operator=(&(this->m_identification).name,(String *)&local_70);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_70);
  std::locale::~locale((locale *)name);
  std::__cxx11::string::~string((string *)&local_90);
  if ((anonymous_namespace)::udevContext != 0) {
    puVar8 = (udev_device *)
             udev_device_new_from_syspath
                       ((anonymous_namespace)::udevContext,
                        *(undefined8 *)((anonymous_namespace)::joystickList + 0x20 + lVar11));
    if (puVar8 == (udev_device *)0x0) {
LAB_0011f9ed:
      poVar9 = err();
      poVar9 = std::operator<<(poVar9,"Failed to get vendor ID of joystick ");
      poVar9 = std::operator<<(poVar9,(string *)((anonymous_namespace)::joystickList + lVar11));
      uVar5 = 0;
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)name,"ID_VENDOR_ID",(allocator<char> *)&devnode_1);
      uVar5 = anon_unknown.dwarf_9f7fb::getUdevAttributeUint(puVar8,(string *)name);
      std::__cxx11::string::~string((string *)name);
      if (uVar5 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)name,"idVendor",(allocator<char> *)&devnode_1);
        uVar5 = anon_unknown.dwarf_9f7fb::getUsbAttributeUint(puVar8,(string *)name);
        std::__cxx11::string::~string((string *)name);
        udev_device_unref(puVar8);
        if (uVar5 == 0) goto LAB_0011f9ed;
      }
      else {
        udev_device_unref(puVar8);
      }
    }
    (this->m_identification).vendorId = uVar5;
    if (((anonymous_namespace)::udevContext == 0) ||
       (puVar8 = (udev_device *)
                 udev_device_new_from_syspath
                           ((anonymous_namespace)::udevContext,
                            *(undefined8 *)((anonymous_namespace)::joystickList + 0x20 + lVar11)),
       puVar8 == (udev_device *)0x0)) {
LAB_0011fac5:
      poVar9 = err();
      poVar9 = std::operator<<(poVar9,"Failed to get product ID of joystick ");
      poVar9 = std::operator<<(poVar9,(string *)(lVar11 + (anonymous_namespace)::joystickList));
      uVar5 = 0;
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)name,"ID_MODEL_ID",(allocator<char> *)&devnode_1);
      uVar5 = anon_unknown.dwarf_9f7fb::getUdevAttributeUint(puVar8,(string *)name);
      std::__cxx11::string::~string((string *)name);
      if (uVar5 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)name,"idProduct",(allocator<char> *)&devnode_1);
        uVar5 = anon_unknown.dwarf_9f7fb::getUsbAttributeUint(puVar8,(string *)name);
        std::__cxx11::string::~string((string *)name);
        udev_device_unref(puVar8);
        if (uVar5 == 0) goto LAB_0011fac5;
      }
      else {
        udev_device_unref(puVar8);
      }
    }
    (this->m_identification).productId = uVar5;
  }
  JoystickState::JoystickState((JoystickState *)name);
  pcVar6 = name;
  pJVar10 = &this->m_state;
  for (lVar11 = 0x11; lVar11 != 0; lVar11 = lVar11 + -1) {
    cVar1 = pcVar6[1];
    cVar2 = pcVar6[2];
    cVar3 = pcVar6[3];
    pJVar10->connected = (bool)pcVar6[0];
    pJVar10->field_0x1 = cVar1;
    pJVar10->field_0x2 = cVar2;
    pJVar10->field_0x3 = cVar3;
    pcVar6 = pcVar6 + (ulong)bVar12 * -8 + 4;
    pJVar10 = (JoystickState *)((long)pJVar10 + (ulong)bVar12 * -8 + 4);
  }
LAB_0011fb17:
  std::__cxx11::string::~string((string *)&devnode);
  if (__fd < 0) {
    return 0;
  }
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool JoystickImpl::open(unsigned int index)
{
    if (index >= joystickList.size())
        return false;

    if (joystickList[index].plugged)
    {
        std::string devnode = joystickList[index].deviceNode;

        // Open the joystick's file descriptor (read-only and non-blocking)
        m_file = ::open(devnode.c_str(), O_RDONLY | O_NONBLOCK);
        if (m_file >= 0)
        {
            // Retrieve the axes mapping
            ioctl(m_file, JSIOCGAXMAP, m_mapping);

            // Get info
            m_identification.name = getJoystickName(index);

            if (udevContext)
            {
                m_identification.vendorId  = getJoystickVendorId(index);
                m_identification.productId = getJoystickProductId(index);
            }

            // Reset the joystick state
            m_state = JoystickState();

            return true;
        }
        else
        {
            err() << "Failed to open joystick " << devnode << ": " << errno << std::endl;
        }
    }

    return false;
}